

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

int count_dups<int>(vector<int,_std::allocator<int>_> *t)

{
  ulong uVar1;
  pointer piVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  undefined1 *__s;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uStack_30;
  
  piVar2 = (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (long)(t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish - (long)piVar2;
  uVar8 = (long)uVar5 >> 2;
  lVar3 = -(uVar8 + 0xf & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffd8 + lVar3;
  uVar7 = 0;
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x10a672;
  memset(__s,0,(long)(int)(uVar5 >> 2));
  uVar5 = 0;
  if (0 < (int)uVar8) {
    uVar5 = uVar8 & 0xffffffff;
  }
  iVar4 = 0;
  for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    uVar6 = uVar7;
    if (__s[uVar7] == '\0') {
      while ((int)uVar6 + 1 < (int)uVar8) {
        uVar1 = uVar6 + 1;
        lVar3 = uVar6 + 1;
        uVar6 = uVar1;
        if (piVar2[uVar7] == piVar2[lVar3]) {
          iVar4 = iVar4 + 1;
          __s[uVar1] = 1;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int count_dups(std::vector<T> &t)
{
    int dups = 0;
    int N = t.size();
    STACKALLOC(bool, mark, t.size());
    memset(mark, 0, N);
    for(int i=0; i<N; ++i) {
        if(mark[i])
            continue;
        for(int j=i+1; j<N; ++j) {
            if(t[i] == t[j]) {
                dups++;
                mark[j] = true;
            }
        }
    }
    return dups;
}